

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5_utils.c
# Opt level: O0

void byteSwap(uint *buf,uint words)

{
  int i;
  uchar *p;
  uint words_local;
  uint *buf_local;
  
  return;
}

Assistant:

static void byteSwap(UWORD32 *buf, unsigned words) {
  md5byte *p;

  /* Only swap bytes for big endian machines */
  int i = 1;

  if (*(char *)&i == 1) return;

  p = (md5byte *)buf;

  do {
    *buf++ = (UWORD32)((unsigned)p[3] << 8 | p[2]) << 16 |
             ((unsigned)p[1] << 8 | p[0]);
    p += 4;
  } while (--words);
}